

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O3

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerAddressModesTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerAddressModesTest *this)

{
  pointer pVVar1;
  Vec4 *pVVar2;
  long lVar3;
  long lVar4;
  int i;
  long lVar5;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  float local_68 [4];
  float local_58 [4];
  float local_48 [4];
  undefined8 local_38;
  float local_30;
  int aiStack_28 [6];
  
  SamplerTest::createVertices(__return_storage_ptr__,&this->super_SamplerTest);
  switch((this->super_SamplerTest).m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(__return_storage_ptr__->
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
    if (lVar3 != 0) {
      lVar3 = lVar3 >> 5;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      pVVar2 = &pVVar1->texCoord;
      do {
        pVVar2->m_data[0] = (pVVar2->m_data[0] + -0.5) * 4.0;
        pVVar2 = pVVar2 + 2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(__return_storage_ptr__->
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
    if (lVar3 != 0) {
      lVar3 = lVar3 >> 5;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      pVVar2 = &pVVar1->texCoord;
      do {
        *(ulong *)pVVar2->m_data =
             CONCAT44(((float)((ulong)*(undefined8 *)pVVar2->m_data >> 0x20) + -0.5) * 4.0,
                      ((float)*(undefined8 *)pVVar2->m_data + -0.5) * 4.0);
        pVVar2 = pVVar2 + 2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(__return_storage_ptr__->
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
    if (lVar3 != 0) {
      lVar3 = lVar3 >> 5;
      lVar4 = 0;
      do {
        local_38 = *(undefined8 *)pVVar1[lVar4].texCoord.m_data;
        local_30 = pVVar1[lVar4].texCoord.m_data[2];
        local_48[0] = 0.5;
        local_48[1] = 0.5;
        local_48[2] = 0.5;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        lVar5 = 0;
        do {
          local_68[lVar5] = *(float *)((long)&local_38 + lVar5 * 4) - local_48[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_58[2] = 0.0;
        local_58[0] = 0.0;
        local_58[1] = 0.0;
        lVar5 = 0;
        do {
          local_68[lVar5 + 4] = local_68[lVar5] * 4.0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        aiStack_28[2] = 0;
        aiStack_28[3] = 1;
        aiStack_28[4] = 2;
        lVar5 = 2;
        do {
          pVVar1[lVar4].texCoord.m_data[aiStack_28[lVar5]] = local_68[lVar5 + 2];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 5);
        lVar4 = lVar4 + 1;
      } while (lVar4 != lVar3 + (ulong)(lVar3 == 0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerAddressModesTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = SamplerTest::createVertices();

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D: case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.x() = (vertices[vertexNdx].texCoord.x() - 0.5f) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_2D:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.xy() = (vertices[vertexNdx].texCoord.swizzle(0, 1) - tcu::Vec2(0.5f)) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_3D:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.xyz() = (vertices[vertexNdx].texCoord.swizzle(0, 1, 2) - tcu::Vec3(0.5f)) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			break;

		default:
			DE_ASSERT(false);
	}

	return vertices;
}